

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::RangeStaticLayerParams::ByteSizeLong(RangeStaticLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(-(uint)(this->endvalue_ != 0.0) & 1);
  sVar2 = uVar3 * 5 + 5;
  sVar1 = uVar3 * 5;
  if (this->startvalue_ != 0.0) {
    sVar1 = sVar2;
  }
  if (NAN(this->startvalue_)) {
    sVar1 = sVar2;
  }
  sVar2 = sVar1;
  if (this->stepsizevalue_ != 0.0) {
    sVar2 = sVar1 + 5;
  }
  if (NAN(this->stepsizevalue_)) {
    sVar2 = sVar1 + 5;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t RangeStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RangeStaticLayerParams)
  size_t total_size = 0;

  // float endValue = 1;
  if (this->endvalue() != 0) {
    total_size += 1 + 4;
  }

  // float startValue = 2;
  if (this->startvalue() != 0) {
    total_size += 1 + 4;
  }

  // float stepSizeValue = 3;
  if (this->stepsizevalue() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}